

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall DeletePostRequest::DeletePostRequest(DeletePostRequest *this,Event *e)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  EventNotValid *this_01;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  allocator local_b2;
  allocator local_b1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [64];
  string local_40;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0,e);
  std::__cxx11::string::string((string *)&local_a0,"type",&local_b1);
  std::__cxx11::string::string(local_80,"post_id",&local_b2);
  keysToBeInEvent._M_len = 2;
  keysToBeInEvent._M_array = &local_a0;
  bVar1 = checkEventKeys(&local_b0,keysToBeInEvent);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_a0._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_b0);
  if (bVar1) {
    this_00 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)e,"post_id");
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(this_00);
    this->id = iVar2;
    return;
  }
  this_01 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"Improper DELETE_POST_REQUEST",(allocator *)&local_a0);
  EventNotValid::EventNotValid(this_01,&local_40);
  __cxa_throw(this_01,&EventNotValid::typeinfo,EventError::~EventError);
}

Assistant:

explicit DeletePostRequest(Event e){
	  if(!checkEventKeys(e, {"type", "post_id"})) {
		  throw EventNotValid("Improper DELETE_POST_REQUEST");
	  }
	  try{
		  id = e["post_id"].get<int>();
	  }
	  catch(...){
		  throw EventNotValid("Improper DELETE_POST_REQUEST");
	  }
  }